

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

bool __thiscall
QItemSelectionModel::isRowSelected(QItemSelectionModel *this,int row,QModelIndex *parent)

{
  QItemSelectionRange *pQVar1;
  int iVar2;
  QItemSelectionModelPrivate *pQVar3;
  QAbstractItemModel *pQVar4;
  pointer pQVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  parameter_type pQVar9;
  int iVar10;
  long lVar11;
  QItemSelectionRange *pQVar12;
  const_iterator cVar13;
  const_iterator cVar14;
  long lVar15;
  pointer this_00;
  QItemSelectionRange *pQVar16;
  long in_FS_OFFSET;
  QItemSelectionModelPrivate *d;
  _Vector_base<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_> local_68;
  anon_class_16_2_e4a7c93d local_50;
  QItemSelectionModelPrivate *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = *(QItemSelectionModelPrivate **)(this + 8);
  local_40 = pQVar3;
  pQVar9 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
           ::value(&pQVar3->model);
  if ((pQVar9 == (parameter_type)0x0) ||
     ((bVar6 = QModelIndex::isValid(parent), bVar6 &&
      (pQVar9 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                ::value(&pQVar3->model), pQVar9 != (parent->m).ptr)))) {
LAB_00404516:
    bVar6 = false;
  }
  else {
    if (((pQVar3->currentCommand).super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
         super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i & 4) != 0) {
      cVar14.i = (pQVar3->currentSelection).super_QList<QItemSelectionRange>.d.ptr;
      lVar15 = (pQVar3->currentSelection).super_QList<QItemSelectionRange>.d.size;
      lVar11 = lVar15 * 0x10;
      pQVar16 = cVar14.i + lVar15;
      local_68._M_impl.super__Vector_impl_data._M_start._0_4_ = row;
      local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)parent;
      for (lVar15 = lVar15 >> 2; cVar13.i = cVar14.i, 0 < lVar15; lVar15 = lVar15 + -1) {
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::{lambda(auto:1_const&)#1}>
                ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::_lambda(auto:1_const&)_1_>
                              *)&local_68,cVar14);
        if (bVar6) goto LAB_00404511;
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::{lambda(auto:1_const&)#1}>
                ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::_lambda(auto:1_const&)_1_>
                              *)&local_68,cVar14.i + 1);
        cVar13.i = cVar14.i + 1;
        if (bVar6) goto LAB_00404511;
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::{lambda(auto:1_const&)#1}>
                ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::_lambda(auto:1_const&)_1_>
                              *)&local_68,cVar14.i + 2);
        cVar13.i = cVar14.i + 2;
        if (bVar6) goto LAB_00404511;
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::{lambda(auto:1_const&)#1}>
                ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::_lambda(auto:1_const&)_1_>
                              *)&local_68,cVar14.i + 3);
        cVar13.i = cVar14.i + 3;
        if (bVar6) goto LAB_00404511;
        cVar14.i = cVar14.i + 4;
        lVar11 = lVar11 + -0x40;
      }
      lVar11 = lVar11 >> 4;
      if (lVar11 == 1) {
LAB_004044fb:
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::{lambda(auto:1_const&)#1}>
                ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::_lambda(auto:1_const&)_1_>
                              *)&local_68,cVar14);
        cVar13.i = cVar14.i;
        if (!bVar6) {
          cVar13.i = pQVar16;
        }
      }
      else if (lVar11 == 2) {
LAB_004044e6:
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::{lambda(auto:1_const&)#1}>
                ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::_lambda(auto:1_const&)_1_>
                              *)&local_68,cVar14);
        cVar13.i = cVar14.i;
        if (!bVar6) {
          cVar14.i = cVar14.i + 1;
          goto LAB_004044fb;
        }
      }
      else {
        if (lVar11 != 3) goto LAB_0040451d;
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::{lambda(auto:1_const&)#1}>
                ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::_lambda(auto:1_const&)_1_>
                              *)&local_68,cVar14);
        if (!bVar6) {
          cVar14.i = cVar14.i + 1;
          goto LAB_004044e6;
        }
      }
LAB_00404511:
      if (cVar13.i != pQVar16) goto LAB_00404516;
    }
LAB_0040451d:
    if (((local_40->currentCommand).super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>
         .super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i & 8) != 0) {
      pQVar16 = (local_40->currentSelection).super_QList<QItemSelectionRange>.d.ptr;
      pQVar12 = pQVar16 + (local_40->currentSelection).super_QList<QItemSelectionRange>.d.size;
      for (; pQVar16 != pQVar12; pQVar16 = pQVar16 + 1) {
        iVar7 = QPersistentModelIndex::row(&pQVar16->tl);
        if ((iVar7 <= row) && (iVar7 = QPersistentModelIndex::row(&pQVar16->br), row <= iVar7)) {
          cVar14.i = (local_40->ranges).super_QList<QItemSelectionRange>.d.ptr;
          lVar15 = (local_40->ranges).super_QList<QItemSelectionRange>.d.size;
          lVar11 = lVar15 * 0x10;
          pQVar1 = cVar14.i + lVar15;
          local_68._M_impl.super__Vector_impl_data._M_start._0_4_ = row;
          local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)pQVar16;
          for (lVar15 = lVar15 >> 2; cVar13.i = cVar14.i, 0 < lVar15; lVar15 = lVar15 + -1) {
            bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::{lambda(auto:1_const&)#1}>
                    ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::_lambda(auto:1_const&)_1_>
                                  *)&local_68,cVar14);
            if (bVar6) goto LAB_0040463f;
            bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::{lambda(auto:1_const&)#1}>
                    ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::_lambda(auto:1_const&)_1_>
                                  *)&local_68,cVar14.i + 1);
            cVar13.i = cVar14.i + 1;
            if (bVar6) goto LAB_0040463f;
            bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::{lambda(auto:1_const&)#1}>
                    ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::_lambda(auto:1_const&)_1_>
                                  *)&local_68,cVar14.i + 2);
            cVar13.i = cVar14.i + 2;
            if (bVar6) goto LAB_0040463f;
            bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::{lambda(auto:1_const&)#1}>
                    ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::_lambda(auto:1_const&)_1_>
                                  *)&local_68,cVar14.i + 3);
            cVar13.i = cVar14.i + 3;
            if (bVar6) goto LAB_0040463f;
            cVar14.i = cVar14.i + 4;
            lVar11 = lVar11 + -0x40;
          }
          lVar11 = lVar11 >> 4;
          if (lVar11 == 1) {
LAB_00404680:
            bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::{lambda(auto:1_const&)#1}>
                    ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::_lambda(auto:1_const&)_1_>
                                  *)&local_68,cVar14);
            cVar13.i = cVar14.i;
            if (!bVar6) {
              cVar13.i = pQVar1;
            }
          }
          else if (lVar11 == 2) {
LAB_00404663:
            bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::{lambda(auto:1_const&)#1}>
                    ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::_lambda(auto:1_const&)_1_>
                                  *)&local_68,cVar14);
            cVar13.i = cVar14.i;
            if (!bVar6) {
              cVar14.i = cVar14.i + 1;
              goto LAB_00404680;
            }
          }
          else {
            if (lVar11 != 3) goto LAB_00404648;
            bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::{lambda(auto:1_const&)#1}>
                    ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::_lambda(auto:1_const&)_1_>
                                  *)&local_68,cVar14);
            if (!bVar6) {
              cVar14.i = cVar14.i + 1;
              goto LAB_00404663;
            }
          }
LAB_0040463f:
          if (cVar13.i != pQVar1) goto LAB_00404516;
        }
LAB_00404648:
      }
    }
    pQVar3 = local_40;
    local_50.d = &local_40;
    local_50.parent = parent;
    QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
    ::value(&local_40->model);
    pQVar4 = (pQVar3->model).super_QPropertyData<QAbstractItemModel_*>.val;
    iVar8 = (*(pQVar4->super_QObject)._vptr_QObject[0x10])(pQVar4,parent);
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>::reserve
              ((vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_> *)
               &local_68,
               (local_40->ranges).super_QList<QItemSelectionRange>.d.size +
               (local_40->currentSelection).super_QList<QItemSelectionRange>.d.size);
    cVar14.i = (local_40->currentSelection).super_QList<QItemSelectionRange>.d.ptr;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<QList<QItemSelectionRange>::const_iterator,std::back_insert_iterator<std::vector<QItemSelectionRangeRefCache,std::allocator<QItemSelectionRangeRefCache>>>>
              (cVar14,cVar14.i +
                      (local_40->currentSelection).super_QList<QItemSelectionRange>.d.size,
               (vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_> *)
               &local_68);
    cVar14.i = (local_40->ranges).super_QList<QItemSelectionRange>.d.ptr;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<QList<QItemSelectionRange>::const_iterator,std::back_insert_iterator<std::vector<QItemSelectionRangeRefCache,std::allocator<QItemSelectionRangeRefCache>>>>
              (cVar14,cVar14.i + (local_40->ranges).super_QList<QItemSelectionRange>.d.size,
               (vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_> *)
               &local_68);
    iVar10 = 0;
    for (iVar7 = 0; iVar7 < iVar8; iVar7 = iVar7 + 1) {
      bVar6 = isRowSelected::anon_class_16_2_e4a7c93d::operator()(&local_50,row,iVar7);
      if (bVar6) {
        pQVar5 = local_68._M_impl.super__Vector_impl_data._M_finish;
        this_00 = local_68._M_impl.super__Vector_impl_data._M_start;
        while( true ) {
          if (this_00 == pQVar5) goto LAB_004047c9;
          bVar6 = QItemSelectionRangeRefCache::contains(this_00,row,iVar7,parent);
          if (bVar6) break;
          this_00 = this_00 + 1;
        }
        iVar2 = this_00->m_right;
        while (iVar7 < iVar2) {
          iVar7 = iVar7 + 1;
          bVar6 = isRowSelected::anon_class_16_2_e4a7c93d::operator()(&local_50,row,iVar7);
          iVar10 = iVar10 + (uint)!bVar6;
        }
        this_00->m_top = -1;
        this_00->m_left = -1;
        this_00->m_bottom = -1;
        this_00->m_right = -1;
        iVar7 = iVar2;
      }
      else {
        iVar10 = iVar10 + 1;
      }
    }
LAB_004047c9:
    bVar6 = iVar10 < iVar8 && iVar8 <= iVar7;
    std::_Vector_base<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>::
    ~_Vector_base(&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool QItemSelectionModel::isRowSelected(int row, const QModelIndex &parent) const
{
    Q_D(const QItemSelectionModel);
    if (!d->model.value())
        return false;
    if (parent.isValid() && d->model != parent.model())
        return false;

    // return false if row exist in currentSelection (Deselect)
    if (d->currentCommand & Deselect) {
        const auto matches = [](auto row, const auto &parent) {
            return [row, &parent](const auto &selection) {
                return row >= selection.top() &&
                       row <= selection.bottom() &&
                       parent == selection.parent();
            };
        };
        if (std::any_of(d->currentSelection.cbegin(), d->currentSelection.cend(), matches(row, parent)))
            return false;
    }
    // return false if ranges in both currentSelection and ranges
    // intersect and have the same row contained
    if (d->currentCommand & Toggle) {
        for (const auto &selection : d->currentSelection) {
            if (row >= selection.top() && row <= selection.bottom()) {
                const auto intersects = [](auto row, const auto &selection) {
                    return [row, &selection](const auto &range) {
                        return row >= range.top() &&
                               row <= range.bottom() &&
                               selection.intersected(range).isValid();
                    };
                };
                if (std::any_of(d->ranges.cbegin(), d->ranges.cend(), intersects(row, selection)))
                    return false;
            }
        }
    }

    auto isSelectable = [&](int row, int column) {
        return isSelectableAndEnabled(d->model->index(row, column, parent).flags());
    };

    const int colCount = d->model->columnCount(parent);
    int unselectable = 0;
    std::vector<QItemSelectionRangeRefCache> cache;
    cache.reserve(d->currentSelection.size() + d->ranges.size());
    std::copy(d->currentSelection.begin(), d->currentSelection.end(), std::back_inserter(cache));
    std::copy(d->ranges.begin(), d->ranges.end(), std::back_inserter(cache));

    // check ranges and currentSelection
    for (int column = 0; column < colCount; ++column) {
        if (!isSelectable(row, column)) {
            ++unselectable;
            continue;
        }
        bool foundSelection = false;
        for (auto &curSel : cache) {
            if (curSel.contains(row, column, parent)) {
                const auto right = curSel.right();
                for (int i = column + 1; i <= right; ++i) {
                    if (!isSelectable(row, i))
                        ++unselectable;
                }
                column = right;
                foundSelection = true;
                curSel.invalidate();
                break;
            }
        }
        if (!foundSelection)
            return false;
    }
    return unselectable < colCount;
}